

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O0

void __thiscall Client::printHeader(Client *this,char *name,Result *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char **args;
  basic_string_view<char> in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  Response *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_70 [32];
  char *local_50;
  size_t local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  local_20 = &local_50;
  local_28 = "{}: {}";
  local_18 = "{}: {}";
  local_50 = "{}: {}";
  local_38 = in_RSI;
  local_10 = local_20;
  local_48 = std::char_traits<char>::length((char_type *)0x18dd1f);
  local_8 = local_28;
  httplib::Result::operator->((Result *)0x18dd47);
  args = (char **)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
             (allocator<char> *)in_stack_ffffffffffffff70);
  httplib::Response::get_header_value
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  spdlog::warn<char_const*&,std::__cxx11::string>
            ((format_string_t<const_char_*&,_std::__cxx11::basic_string<char>_>)
             in_stack_ffffffffffffff58,args,local_38);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  return;
}

Assistant:

void printHeader(const char* name, const httplib::Result& result) const {
        spdlog::warn("{}: {}", name, result->get_header_value(name));
    }